

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

CompilerCPP * __thiscall
spirv_cross::CompilerCPP::argument_decl_abi_cxx11_(CompilerCPP *this,Parameter *arg)

{
  uint32_t uVar1;
  SPIRType *type_00;
  SPIRVariable *pSVar2;
  ulong uVar3;
  size_t sVar4;
  long in_RDX;
  bool bVar5;
  char *local_d0;
  undefined1 local_c8 [64];
  uint local_88;
  uint32_t i;
  string local_78 [8];
  string variable_name;
  string local_58 [8];
  string base;
  SPIRVariable *var;
  bool constref;
  SPIRType *type;
  Parameter *arg_local;
  CompilerCPP *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 4));
  type_00 = Compiler::expression_type((Compiler *)arg,uVar1);
  bVar5 = true;
  if ((type_00->pointer & 1U) != 0) {
    bVar5 = *(int *)(in_RDX + 0xc) == 0;
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 4));
  pSVar2 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)arg,uVar1);
  (**(code **)(*(long *)arg + 0x98))(local_58,arg,type_00,0);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).self);
  (**(code **)(*(long *)arg + 0x30))(local_78,arg,uVar1,1);
  Compiler::remap_variable_type_name((Compiler *)arg,type_00,local_78,local_58);
  local_88 = 0;
  while( true ) {
    uVar3 = (ulong)local_88;
    sVar4 = VectorView<unsigned_int>::size(&(type_00->array).super_VectorView<unsigned_int>);
    if (sVar4 <= uVar3) break;
    CompilerGLSL::to_array_size_abi_cxx11_
              ((CompilerGLSL *)local_c8,(SPIRType *)arg,(uint32_t)type_00);
    join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)(local_c8 + 0x20),(char (*) [12])"std::array<",local_58,
               (char (*) [3])0x421228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
               (char (*) [2])0x4222ea);
    ::std::__cxx11::string::operator=((string *)local_58,(string *)(local_c8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_c8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_c8);
    local_88 = local_88 + 1;
  }
  local_d0 = "";
  if (bVar5) {
    local_d0 = "const ";
  }
  join<char_const*,std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&>
            ((spirv_cross *)this,&local_d0,local_58,(char (*) [3])0x420a90,local_78);
  ::std::__cxx11::string::~string((string *)local_78);
  ::std::__cxx11::string::~string((string *)local_58);
  return this;
}

Assistant:

string CompilerCPP::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &type = expression_type(arg.id);
	bool constref = !type.pointer || arg.write_count == 0;

	auto &var = get<SPIRVariable>(arg.id);

	string base = type_to_glsl(type);
	string variable_name = to_name(var.self);
	remap_variable_type_name(type, variable_name, base);

	for (uint32_t i = 0; i < type.array.size(); i++)
		base = join("std::array<", base, ", ", to_array_size(type, i), ">");

	return join(constref ? "const " : "", base, " &", variable_name);
}